

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O2

void __thiscall
FIX::ServerWrapper::onEvent(ServerWrapper *this,SocketMonitor *monitor,socket_handle socket)

{
  _Rb_tree_header *__addr_len;
  SocketServer *this_00;
  Strategy *pSVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  iterator iVar5;
  sockaddr *__addr;
  uint local_34;
  
  local_34 = socket;
  iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->m_sockets)._M_t,(key_type *)&local_34);
  uVar2 = local_34;
  __addr_len = &(this->m_sockets)._M_t._M_impl.super__Rb_tree_header;
  this_00 = this->m_server;
  pSVar1 = this->m_strategy;
  if ((_Rb_tree_header *)iVar5._M_node == __addr_len) {
    iVar4 = (*pSVar1->_vptr_Strategy[4])(pSVar1,this_00,(ulong)local_34);
    if ((char)iVar4 == '\0') {
      (*(this->super_Strategy)._vptr_Strategy[5])(this,monitor,(ulong)local_34);
    }
  }
  else {
    uVar3 = SocketServer::accept(this_00,local_34,__addr,(socklen_t *)__addr_len);
    (*pSVar1->_vptr_Strategy[2])(pSVar1,this_00,(ulong)uVar2,(ulong)uVar3);
  }
  return;
}

Assistant:

void onEvent( SocketMonitor& monitor, socket_handle socket )
  {
    if( m_sockets.find(socket) != m_sockets.end() )
    {
      m_strategy.onConnect( m_server, socket, m_server.accept(socket) );
    }
    else
    {
      if( !m_strategy.onData( m_server, socket ) )
        onError( monitor, socket );
    }
  }